

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O0

void gen_person(person_t *p)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int klen;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = rand();
  iVar1 = iVar1 % 0x400 + -1;
  if (iVar1 < 0xd) {
    iVar1 = 0xd;
  }
  iVar2 = rand();
  *(int *)(in_RDI + 0xe08) = iVar2 % 100;
  gen_random((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  gen_random((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  gen_random((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  gen_random((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  gen_random((char *)CONCAT44(iVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void gen_person(person_t *p){

    int klen = rand() % MAXKEY_LEN - 1;
    if(klen<=MAXITR_LEN){
        klen=MAXITR_LEN+1;
    }
    p->age = rand() % 100;
    gen_random(p->key, klen);
    gen_random(p->name, klen);
    gen_random(p->city, 12);
    gen_random(p->state, 2);
    gen_random(p->desc, 512);

}